

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::RgbaInputFile::~RgbaInputFile(RgbaInputFile *this)

{
  void *pvVar1;
  __pthread_internal_list *p_Var2;
  FromYca *in_RDI;
  MultiPartInputFile *this_00;
  
  (in_RDI->super_mutex).super___mutex_base._M_mutex.__align = (long)&PTR__RgbaInputFile_004dca30;
  if ((*(long *)((long)&(in_RDI->super_mutex).super___mutex_base._M_mutex + 0x10) != 0) &&
     (pvVar1 = *(void **)((long)&(in_RDI->super_mutex).super___mutex_base._M_mutex + 0x10),
     pvVar1 != (void *)0x0)) {
    operator_delete(pvVar1,8);
  }
  if ((*(long *)((long)&(in_RDI->super_mutex).super___mutex_base._M_mutex + 8) != 0) &&
     (this_00 = *(MultiPartInputFile **)
                 ((long)&(in_RDI->super_mutex).super___mutex_base._M_mutex + 8),
     this_00 != (MultiPartInputFile *)0x0)) {
    MultiPartInputFile::~MultiPartInputFile(this_00);
    operator_delete(this_00,0x20);
  }
  p_Var2 = (in_RDI->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev;
  if (p_Var2 != (__pthread_internal_list *)0x0) {
    FromYca::~FromYca(in_RDI);
    operator_delete(p_Var2,0x188);
  }
  std::__cxx11::string::~string
            ((string *)&(in_RDI->super_mutex).super___mutex_base._M_mutex.__data.__list.__next);
  return;
}

Assistant:

RgbaInputFile::~RgbaInputFile ()
{
    if (_inputPart) { delete _inputPart; }
    if (_multiPartFile) { delete _multiPartFile; }
    delete _fromYca;
}